

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O2

bool soul::TypeRules::canSilentlyCastTo(Type *dest,Value *value)

{
  Primitive PVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int64_t iVar5;
  float fVar6;
  float fVar7;
  
  if ((dest->category == array) && (dest->boundingSize == 0)) {
    return false;
  }
  bVar4 = canSilentlyCastTo(dest,&value->type);
  if (bVar4) {
    return true;
  }
  if (((dest->category & ~primitive) == wrap) &&
     (((value->type).primitiveType.type - int32 < 2 ||
      (((value->type).category & ~primitive) == wrap)))) {
    iVar5 = soul::Value::getAsInt64(value);
    bVar4 = Type::isValidBoundedIntIndex<long>(dest,iVar5);
    return bVar4;
  }
  PVar1 = (dest->primitiveType).type;
  if (PVar1 == float32) {
LAB_00207a43:
    PVar1 = (value->type).primitiveType.type;
    if (PVar1 == float64) {
      fVar6 = soul::Value::getAsFloat(value);
      dVar2 = (double)fVar6;
LAB_00207a7e:
      dVar3 = soul::Value::getAsDouble(value);
      bVar4 = dVar3 == dVar2;
      goto LAB_00207af0;
    }
    if (1 < PVar1 - int32) {
      return false;
    }
    fVar6 = soul::Value::getAsFloat(value);
    iVar5 = soul::Value::getAsInt64(value);
    fVar7 = (float)(int)iVar5;
  }
  else {
    if (1 < PVar1 - int32) {
      if (PVar1 != complex32) {
        return false;
      }
      goto LAB_00207a43;
    }
    PVar1 = (value->type).primitiveType.type;
    if (PVar1 != float32) {
      if (PVar1 != float64) {
        return false;
      }
      iVar5 = soul::Value::getAsInt64(value);
      dVar2 = (double)(int)iVar5;
      goto LAB_00207a7e;
    }
    iVar5 = soul::Value::getAsInt64(value);
    fVar6 = (float)(int)iVar5;
    fVar7 = soul::Value::getAsFloat(value);
  }
  bVar4 = fVar7 == fVar6;
LAB_00207af0:
  return (bool)(-bVar4 & 1);
}

Assistant:

static bool canSilentlyCastTo (const Type& dest, const Value& value)
    {
        const auto& type = value.getType();

        if (dest.isUnsizedArray())
            return false;

        if (canSilentlyCastTo (dest, type))
            return true;

        if (dest.isBoundedInt() && (type.isInteger() || type.isBoundedInt()))
            return dest.isValidBoundedIntIndex (value.getAsInt64());

        if (dest.isFloat32())
        {
            if (type.isFloat64())
                return static_cast<double> (value.getAsFloat()) == value.getAsDouble();

            if (type.isInteger())
                return value.getAsFloat() == static_cast<float> (value.getAsInt32());
        }

        if (dest.isInteger())
        {
            if (type.isFloat64())
                return value.getAsInt32() == value.getAsDouble();

            if (type.isFloat32())
                return static_cast<float> (value.getAsInt32()) == value.getAsFloat();
        }

        if (dest.isComplex32())
        {
            if (type.isFloat64())
                return static_cast<double> (value.getAsFloat()) == value.getAsDouble();

            if (type.isInteger())
                return value.getAsFloat() == static_cast<float> (value.getAsInt32());
        }

        return false;
    }